

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O1

int eckey_priv_encode(CBB *out,EVP_PKEY *key)

{
  EC_KEY *key_00;
  uint uVar1;
  int iVar2;
  EC_GROUP *group;
  CBB pkcs8;
  CBB algorithm;
  CBB private_key;
  CBB CStack_a8;
  CBB local_78;
  CBB local_48;
  
  key_00 = (EC_KEY *)key->pkey;
  uVar1 = EC_KEY_get_enc_flags((EC_KEY *)key_00);
  iVar2 = CBB_add_asn1(out,&CStack_a8,0x20000010);
  if ((((iVar2 != 0) && (iVar2 = CBB_add_asn1_uint64(&CStack_a8,0), iVar2 != 0)) &&
      (iVar2 = CBB_add_asn1(&CStack_a8,&local_78,0x20000010), iVar2 != 0)) &&
     (iVar2 = CBB_add_asn1_element(&local_78,6,ec_asn1_meth.oid,7), iVar2 != 0)) {
    group = (EC_GROUP *)EC_KEY_get0_group((EC_KEY *)key_00);
    iVar2 = EC_KEY_marshal_curve_name(&local_78,group);
    if (((iVar2 != 0) && (iVar2 = CBB_add_asn1(&CStack_a8,&local_48,4), iVar2 != 0)) &&
       ((iVar2 = EC_KEY_marshal_private_key(&local_48,key_00,uVar1 | 1), iVar2 != 0 &&
        (iVar2 = CBB_flush(out), iVar2 != 0)))) {
      return 1;
    }
  }
  ERR_put_error(6,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec_asn1.cc"
                ,0x7f);
  return 0;
}

Assistant:

static int eckey_priv_encode(CBB *out, const EVP_PKEY *key) {
  const EC_KEY *ec_key = reinterpret_cast<const EC_KEY *>(key->pkey);

  // Omit the redundant copy of the curve name. This contradicts RFC 5915 but
  // aligns with PKCS #11. SEC 1 only says they may be omitted if known by other
  // means. Both OpenSSL and NSS omit the redundant parameters, so we omit them
  // as well.
  unsigned enc_flags = EC_KEY_get_enc_flags(ec_key) | EC_PKEY_NO_PARAMETERS;

  // See RFC 5915.
  CBB pkcs8, algorithm, private_key;
  if (!CBB_add_asn1(out, &pkcs8, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&pkcs8, 0 /* version */) ||
      !CBB_add_asn1(&pkcs8, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, ec_asn1_meth.oid,
                            ec_asn1_meth.oid_len) ||
      !EC_KEY_marshal_curve_name(&algorithm, EC_KEY_get0_group(ec_key)) ||
      !CBB_add_asn1(&pkcs8, &private_key, CBS_ASN1_OCTETSTRING) ||
      !EC_KEY_marshal_private_key(&private_key, ec_key, enc_flags) ||
      !CBB_flush(out)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_ENCODE_ERROR);
    return 0;
  }

  return 1;
}